

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

void Curl_freeset(Curl_easy *data)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    (*Curl_cfree)((data->set).str[lVar1]);
    (data->set).str[lVar1] = (char *)0x0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x3f);
  if ((data->change).referer_alloc == true) {
    (*Curl_cfree)((data->change).referer);
    (data->change).referer_alloc = false;
  }
  (data->change).referer = (char *)0x0;
  if ((data->change).url_alloc == true) {
    (*Curl_cfree)((data->change).url);
    (data->change).url_alloc = false;
  }
  (data->change).url = (char *)0x0;
  Curl_mime_cleanpart(&(data->set).mimepost);
  return;
}

Assistant:

void Curl_freeset(struct Curl_easy *data)
{
  /* Free all dynamic strings stored in the data->set substructure. */
  enum dupstring i;
  for(i = (enum dupstring)0; i < STRING_LAST; i++) {
    Curl_safefree(data->set.str[i]);
  }

  if(data->change.referer_alloc) {
    Curl_safefree(data->change.referer);
    data->change.referer_alloc = FALSE;
  }
  data->change.referer = NULL;
  if(data->change.url_alloc) {
    Curl_safefree(data->change.url);
    data->change.url_alloc = FALSE;
  }
  data->change.url = NULL;

  Curl_mime_cleanpart(&data->set.mimepost);
}